

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O1

void cmGetCMakeInputs(cmGlobalGenerator *gg,string *sourceDir,string *buildDir,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *internalFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *explicitFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tmpFiles)

{
  pointer pcVar1;
  string *psVar2;
  int iVar3;
  string *psVar4;
  pointer ppcVar5;
  long lVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar7;
  bool bVar8;
  string cmakeRootDir;
  string toAdd;
  string startOfFile;
  long *local_100;
  ulong local_f8;
  long local_f0 [2];
  long *local_e0;
  ulong local_d8;
  long local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  pointer local_60;
  pointer local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  string *local_38;
  
  local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)explicitFiles;
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tmpFiles;
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)internalFiles;
  local_38 = buildDir;
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_e0 = local_d0;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + psVar4->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_e0,local_d8,0,'\x01');
  ppcVar5 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_60 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (ppcVar5 != local_60) {
    do {
      psVar2 = ((*ppcVar5)->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = ppcVar5;
      for (psVar4 = ((*ppcVar5)->ListFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1
          ) {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)psVar4);
        if (local_78 == local_d8) {
          if (local_78 == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp(local_80,local_e0,local_78);
            bVar7 = iVar3 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          bVar8 = false;
        }
        else {
          local_100 = local_f0;
          pcVar1 = (local_38->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,pcVar1,pcVar1 + local_38->_M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
          lVar6 = std::__cxx11::string::find((char *)psVar4,(ulong)local_100,0);
          bVar8 = lVar6 == 0;
          if (local_100 != local_f0) {
            operator_delete(local_100,local_f0[0] + 1);
          }
        }
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        pcVar1 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar1,pcVar1 + psVar4->_M_string_length);
        if (sourceDir->_M_string_length != 0) {
          cmSystemTools::RelativePath(&local_a0,sourceDir,psVar4);
          if (local_a0._M_string_length < local_c0._M_string_length) {
            std::__cxx11::string::_M_assign((string *)&local_c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        this = local_40;
        if ((!bVar7) && (this = local_50, bVar8)) {
          this = local_48;
        }
        if (this != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this,&local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
      }
      ppcVar5 = local_58 + 1;
    } while (ppcVar5 != local_60);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  return;
}

Assistant:

void cmGetCMakeInputs(const cmGlobalGenerator* gg,
                      const std::string& sourceDir,
                      const std::string& buildDir,
                      std::vector<std::string>* internalFiles,
                      std::vector<std::string>* explicitFiles,
                      std::vector<std::string>* tmpFiles)
{
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot() + '/';
  std::vector<cmMakefile*> const& makefiles = gg->GetMakefiles();
  for (cmMakefile const* mf : makefiles) {
    for (std::string const& lf : mf->GetListFiles()) {

      const std::string startOfFile = lf.substr(0, cmakeRootDir.size());
      const bool isInternal = (startOfFile == cmakeRootDir);
      const bool isTemporary = !isInternal && (lf.find(buildDir + '/') == 0);

      std::string toAdd = lf;
      if (!sourceDir.empty()) {
        const std::string& relative =
          cmSystemTools::RelativePath(sourceDir, lf);
        if (toAdd.size() > relative.size()) {
          toAdd = relative;
        }
      }

      if (isInternal) {
        if (internalFiles) {
          internalFiles->push_back(std::move(toAdd));
        }
      } else {
        if (isTemporary) {
          if (tmpFiles) {
            tmpFiles->push_back(std::move(toAdd));
          }
        } else {
          if (explicitFiles) {
            explicitFiles->push_back(std::move(toAdd));
          }
        }
      }
    }
  }
}